

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O2

int __thiscall r3d::init(r3d *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  undefined8 extraout_RAX;
  r3d *this_00;
  long lVar2;
  
  *(undefined4 *)(this + 0x1400) = 4;
  *(undefined8 *)this = 0x300000001;
  *(undefined4 *)(this + 8) = 2;
  *(undefined8 *)(this + 0x28) = 0x300000002;
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x50) = 0x300000000;
  *(undefined4 *)(this + 0x58) = 1;
  uVar1 = 0x200000001;
  *(undefined8 *)(this + 0x78) = 0x200000001;
  *(undefined4 *)(this + 0x80) = 0;
  this_00 = this + 0x10;
  for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 0x18) {
    Few<double,_3>::operator=((Few<double,_3> *)this_00,(Few<double,_3> *)(ctx + lVar2));
    this_00 = this_00 + 0x28;
    uVar1 = extraout_RAX;
  }
  return (int)uVar1;
}

Assistant:

R3D_INLINE void init(Polytope<3>& poly, Few<Vector<3>, 4> verts) {
  // initialize graph connectivity
  poly.nverts = 4;
  poly.verts[0].pnbrs[0] = 1;
  poly.verts[0].pnbrs[1] = 3;
  poly.verts[0].pnbrs[2] = 2;
  poly.verts[1].pnbrs[0] = 2;
  poly.verts[1].pnbrs[1] = 3;
  poly.verts[1].pnbrs[2] = 0;
  poly.verts[2].pnbrs[0] = 0;
  poly.verts[2].pnbrs[1] = 3;
  poly.verts[2].pnbrs[2] = 1;
  poly.verts[3].pnbrs[0] = 1;
  poly.verts[3].pnbrs[1] = 2;
  poly.verts[3].pnbrs[2] = 0;

  // copy vertex coordinates
  for (Int v = 0; v < 4; ++v) poly.verts[v].pos = verts[v];
}